

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O0

Keyset * __thiscall GT7VolumeFile::getKeyset(GT7VolumeFile *this)

{
  int iVar1;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc4;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  if (getKeyset()::keyset == '\0') {
    iVar1 = __cxa_guard_acquire(&getKeyset()::keyset);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
      Keyset::Keyset((Keyset *)CONCAT44(in_stack_ffffffffffffffc4,0xb651f2fb),
                     (string *)0x9eb1fe65050da9a1,
                     (Key *)CONCAT44(0xc9da80a5,in_stack_ffffffffffffffb0));
      std::__cxx11::string::~string(local_28);
      std::allocator<char>::~allocator(&local_29);
      __cxa_atexit(Keyset::~Keyset,&getKeyset::keyset,&__dso_handle);
      __cxa_guard_release(&getKeyset()::keyset);
    }
  }
  return &getKeyset::keyset;
}

Assistant:

const Keyset& GT7VolumeFile::getKeyset() const
{
	static const Keyset keyset({
		"KYZYLKUM-873068469", {{ 0xC9DA80A5, 0x050DA9A1, 0x9EB1FE65, 0xB651F2FB }}
	});
	return keyset;
}